

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int buildCharField(charField *cf,bstring b1)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = -1;
  if (((b1 != (bstring)0x0) && (b1->data != (uchar *)0x0)) && (0 < b1->slen)) {
    cf->content[6] = 0;
    cf->content[7] = 0;
    cf->content[4] = 0;
    cf->content[5] = 0;
    cf->content[2] = 0;
    cf->content[3] = 0;
    cf->content[0] = 0;
    cf->content[1] = 0;
    iVar1 = 0;
    uVar2 = (ulong)(uint)b1->slen;
    if (b1->slen < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      cf->content[b1->data[uVar3] >> 5] =
           cf->content[b1->data[uVar3] >> 5] | 1L << (b1->data[uVar3] & 0x1f);
    }
  }
  return iVar1;
}

Assistant:

static int buildCharField (struct charField * cf, const bstring b1) {
int i;
	if (b1 == NULL || b1->data == NULL || b1->slen <= 0) return BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b1->slen; i++) {
		unsigned int c = (unsigned int) b1->data[i];
		cf->content[c >> LONG_LOG_BITS_QTY] |= ((LONG_TYPE) 1) << (c & (LONG_BITS_QTY-1));
	}
	return 0;
}